

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O0

string * __thiscall
chaiscript::ChaiScript_Basic::get_type_name<Type_Name_MyClass>
          (string *__return_storage_ptr__,ChaiScript_Basic *this)

{
  Type_Info local_30;
  ChaiScript_Basic *local_18;
  ChaiScript_Basic *this_local;
  
  local_18 = this;
  this_local = (ChaiScript_Basic *)__return_storage_ptr__;
  user_type<Type_Name_MyClass>();
  get_type_name_abi_cxx11_(__return_storage_ptr__,this,&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string get_type_name() const {
      return get_type_name(user_type<T>());
    }